

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateGeneralTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::DynamicState::anon_unknown_4::StatePersistenceTestInstance::iterate
          (TestStatus *__return_storage_ptr__,StatePersistenceTestInstance *this)

{
  Context *this_00;
  DeviceInterface *pDVar1;
  Image *this_01;
  TestStatus *pTVar2;
  bool bVar3;
  VkResult result;
  VkQueue pVVar4;
  Allocator *allocator;
  int y;
  int x;
  float fVar5;
  float fVar6;
  long *local_1b0;
  long local_1a8;
  long local_1a0 [2];
  int local_18c;
  undefined8 local_188;
  undefined4 local_180;
  TestStatus *local_178;
  TestLog *local_170;
  VkQueue local_168;
  StatePersistenceTestInstance *local_160;
  double local_158;
  double local_150;
  ConstPixelBufferAccess renderedFrame;
  VkRect2D scissor_2;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  Texture2D referenceFrame;
  VkRect2D scissor_1;
  VkViewport viewport;
  VkSubmitInfo submitInfo;
  
  this_00 = (this->super_DynamicStateBaseClass).super_TestInstance.m_context;
  local_170 = this_00->m_testCtx->m_log;
  local_178 = __return_storage_ptr__;
  pVVar4 = Context::getUniversalQueue(this_00);
  DynamicStateBaseClass::beginRenderPass(&this->super_DynamicStateBaseClass);
  viewport.x = 0.0;
  viewport.y = 0.0;
  viewport.width = 128.0;
  viewport.height = 128.0;
  viewport.minDepth = 0.0;
  viewport.maxDepth = 0.0;
  scissor_1.offset.x = 0;
  scissor_1.offset.y = 0;
  scissor_1.extent.width = 0x40;
  scissor_1.extent.height = 0x40;
  scissor_2.offset.x = 0x40;
  scissor_2.offset.y = 0x40;
  scissor_2.extent.width = 0x40;
  scissor_2.extent.height = 0x40;
  DynamicStateBaseClass::setDynamicRasterizationState
            (&this->super_DynamicStateBaseClass,1.0,0.0,0.0,0.0);
  DynamicStateBaseClass::setDynamicBlendState(&this->super_DynamicStateBaseClass,0.0,0.0,0.0,0.0);
  DynamicStateBaseClass::setDynamicDepthStencilState
            (&this->super_DynamicStateBaseClass,-1.0,1.0,0xffffffff,0xffffffff,0,0xffffffff,
             0xffffffff,0);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x4c])
            (pDVar1,(this->super_DynamicStateBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DynamicStateBaseClass).m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x58])
            (pDVar1,(this->super_DynamicStateBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  DynamicStateBaseClass::setDynamicViewportState
            (&this->super_DynamicStateBaseClass,1,&viewport,&scissor_1);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x59])
            (pDVar1,(this->super_DynamicStateBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,4,1,0,0);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x4c])
            (pDVar1,(this->super_DynamicStateBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->m_pipelineAdditional).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
             object.m_internal);
  DynamicStateBaseClass::setDynamicViewportState
            (&this->super_DynamicStateBaseClass,1,&viewport,&scissor_2);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x59])
            (pDVar1,(this->super_DynamicStateBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,6,1,4,0);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x76])
            (pDVar1,(this->super_DynamicStateBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x4a])
            (pDVar1,(this->super_DynamicStateBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,pVVar4,1);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  local_168 = pVVar4;
  result = (*pDVar1->_vptr_DeviceInterface[3])(pDVar1,pVVar4);
  ::vk::checkResult(result,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/dynamic_state/vktDynamicStateGeneralTests.cpp"
                    ,0x17a);
  local_160 = this;
  renderedFrame.m_format =
       ::vk::mapVkFormat((this->super_DynamicStateBaseClass).m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D(&referenceFrame,&renderedFrame.m_format,0x80,0x80);
  tcu::Texture2D::allocLevel(&referenceFrame,0);
  renderedFrame.m_format.order = R;
  renderedFrame.m_format.type = SNORM_INT8;
  renderedFrame.m_size.m_data[0] = 0;
  renderedFrame.m_size.m_data[1] = 0x3f800000;
  tcu::clear(referenceFrame.super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame);
  if (0 < referenceFrame.m_height) {
    local_158 = (double)referenceFrame.m_height * 0.5;
    local_150 = (double)referenceFrame.m_width * 0.5;
    y = 0;
    local_18c = referenceFrame.m_height;
    do {
      if (0 < referenceFrame.m_width) {
        fVar5 = (float)((double)y / local_158) + -1.0;
        x = 0;
        do {
          fVar6 = (float)((double)x / local_150) + -1.0;
          if ((0.0 < fVar6) || (fVar6 < -1.0 || (fVar5 < -1.0 || 0.0 < fVar5))) {
            if ((fVar6 < 1.0) && (0.0 < fVar6 && (fVar5 <= 1.0 && 0.0 < fVar5))) {
              renderedFrame.m_format.order = R;
              renderedFrame.m_format.type = SNORM_INT8;
              renderedFrame.m_size.m_data[0] = 0x3f800000;
              renderedFrame.m_size.m_data[1] = 0x3f800000;
              tcu::PixelBufferAccess::setPixel
                        (referenceFrame.super_TextureLevelPyramid.m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame,x,y,0);
            }
          }
          else {
            renderedFrame.m_format.order = R;
            renderedFrame.m_format.type = 0x3f800000;
            renderedFrame.m_size.m_data[0] = 0;
            renderedFrame.m_size.m_data[1] = 0x3f800000;
            tcu::PixelBufferAccess::setPixel
                      (referenceFrame.super_TextureLevelPyramid.m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame,x,y,0);
          }
          x = x + 1;
        } while (referenceFrame.m_width != x);
      }
      y = y + 1;
    } while (y != local_18c);
  }
  this_01 = (local_160->super_DynamicStateBaseClass).m_colorTargetImage.m_ptr;
  allocator = Context::getDefaultAllocator
                        ((local_160->super_DynamicStateBaseClass).super_TestInstance.m_context);
  local_180 = 0;
  local_188 = 0;
  Draw::Image::readSurface
            (&renderedFrame,this_01,local_168,allocator,VK_IMAGE_LAYOUT_GENERAL,
             (VkOffset3D)(ZEXT412(0) << 0x40),0x80,0x80,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  bVar3 = tcu::fuzzyCompare(local_170,"Result","Image comparison result",
                            &(referenceFrame.super_TextureLevelPyramid.m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess,&renderedFrame,0.05,COMPARE_LOG_RESULT);
  pTVar2 = local_178;
  local_1b0 = local_1a0;
  if (bVar3) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"Image verification passed","");
    pTVar2->m_code = QP_TEST_RESULT_PASS;
    (pTVar2->m_description)._M_dataplus._M_p = (pointer)&(pTVar2->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar2->m_description,local_1b0,local_1a8 + (long)local_1b0);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"Image verification failed","");
    pTVar2->m_code = QP_TEST_RESULT_FAIL;
    (pTVar2->m_description)._M_dataplus._M_p = (pointer)&(pTVar2->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar2->m_description,local_1b0,local_1a8 + (long)local_1b0);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  tcu::Texture3D::~Texture3D((Texture3D *)&referenceFrame);
  return pTVar2;
}

Assistant:

virtual tcu::TestStatus iterate(void)
	{
		tcu::TestLog &log				= m_context.getTestContext().getLog();
		const vk::VkQueue queue			= m_context.getUniversalQueue();

		beginRenderPass();

		// bind states here
		const vk::VkViewport viewport	= { 0.0f, 0.0f, (float)WIDTH, (float)HEIGHT, 0.0f, 0.0f };
		const vk::VkRect2D scissor_1	= { { 0, 0 }, { WIDTH / 2, HEIGHT / 2 } };
		const vk::VkRect2D scissor_2	= { { WIDTH / 2, HEIGHT / 2 }, { WIDTH / 2, HEIGHT / 2 } };

		setDynamicRasterizationState();
		setDynamicBlendState();
		setDynamicDepthStencilState();

		m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

		const vk::VkDeviceSize vertexBufferOffset = 0;
		const vk::VkBuffer vertexBuffer = m_vertexBuffer->object();
		m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

		// bind first state
		setDynamicViewportState(1, &viewport, &scissor_1);
		// draw quad using vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP
		m_vk.cmdDraw(*m_cmdBuffer, 4, 1, 0, 0);

		m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipelineAdditional);

		// bind second state
		setDynamicViewportState(1, &viewport, &scissor_2);
		// draw quad using vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST
		m_vk.cmdDraw(*m_cmdBuffer, 6, 1, 4, 0);

		m_vk.cmdEndRenderPass(*m_cmdBuffer);
		m_vk.endCommandBuffer(*m_cmdBuffer);

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

		//validation
		VK_CHECK(m_vk.queueWaitIdle(queue));

		tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
		referenceFrame.allocLevel(0);

		const deInt32 frameWidth	= referenceFrame.getWidth();
		const deInt32 frameHeight	= referenceFrame.getHeight();

		tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

		for (int y = 0; y < frameHeight; y++)
		{
			const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

			for (int x = 0; x < frameWidth; x++)
			{
				const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

				if (yCoord >= -1.0f && yCoord <= 0.0f && xCoord >= -1.0f && xCoord <= 0.0f)
					referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f), x, y);
				else if (yCoord > 0.0f && yCoord <= 1.0f && xCoord > 0.0f && xCoord < 1.0f)
					referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f), x, y);
			}
		}

		const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
		const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
			vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

		if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
			referenceFrame.getLevel(0), renderedFrame, 0.05f,
			tcu::COMPARE_LOG_RESULT))
		{
			return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Image verification failed");
		}

		return tcu::TestStatus(QP_TEST_RESULT_PASS, "Image verification passed");
	}